

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# typechecking.cc
# Opt level: O0

void __thiscall
tchecker::details::statement_typechecker_t::statement_typechecker_t
          (statement_typechecker_t *this,integer_variables_t *localvars,integer_variables_t *intvars
          ,clock_variables_t *clocks,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *error)

{
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *error_local;
  clock_variables_t *clocks_local;
  integer_variables_t *intvars_local;
  integer_variables_t *localvars_local;
  statement_typechecker_t *this_local;
  
  statement_visitor_t::statement_visitor_t(&this->super_statement_visitor_t);
  (this->super_statement_visitor_t)._vptr_statement_visitor_t =
       (_func_int **)&PTR__statement_typechecker_t_00348648;
  std::shared_ptr<tchecker::typed_statement_t>::shared_ptr(&this->_typed_stmt,(nullptr_t)0x0);
  integer_variables_t::integer_variables_t(&this->_localvars,localvars);
  this->_intvars = intvars;
  this->_clocks = clocks;
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&this->_error,error);
  return;
}

Assistant:

statement_typechecker_t(tchecker::integer_variables_t const & localvars, tchecker::integer_variables_t const & intvars,
                          tchecker::clock_variables_t const & clocks, std::function<void(std::string const &)> error)
      : _typed_stmt(nullptr), _localvars(localvars), _intvars(intvars), _clocks(clocks), _error(error)
  {
  }